

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_GenerateOutput(FAudio *audio,float *output)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  float *in_RSI;
  float *in_RDI;
  FAudioSubmixVoice *unaff_retaddr;
  FAudioEngineCallback *callback;
  float *effectOut;
  LinkedList *list;
  uint32_t totalSamples;
  FAudioSourceVoice *in_stack_ffffffffffffffd0;
  long *local_20;
  
  if (*(char *)((long)in_RDI + 1) != '\0') {
    FAudio_OPERATIONSET_Execute((FAudio *)in_stack_ffffffffffffffd0);
    FAudio_PlatformLockMutex((FAudioMutex)0x12e566);
    for (local_20 = *(long **)(in_RDI + 10); local_20 != (long *)0x0; local_20 = (long *)local_20[1]
        ) {
      in_stack_ffffffffffffffd0 = (FAudioSourceVoice *)*local_20;
      if (*(FAudioMasteringVoice **)&in_stack_ffffffffffffffd0->sends != (FAudioMasteringVoice *)0x0
         ) {
        (*(code *)*(FAudioMasteringVoice **)&in_stack_ffffffffffffffd0->sends)
                  (in_stack_ffffffffffffffd0);
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x12e5c3);
    if (*(long *)(*(long *)(in_RDI + 4) + 0xd0) == 0) {
      *(float **)(*(long *)(in_RDI + 4) + 200) = in_RSI;
    }
    else {
      *(undefined8 *)(*(long *)(in_RDI + 4) + 200) = *(undefined8 *)(*(long *)(in_RDI + 4) + 0xd0);
      SDL_memset(*(undefined8 *)(*(long *)(in_RDI + 4) + 0xd0),0,
                 (ulong)(uint)in_RDI[3] * 4 * (ulong)*(uint *)(*(long *)(in_RDI + 4) + 0xd8));
    }
    FAudio_PlatformLockMutex((FAudioMutex)0x12e653);
    for (local_20 = *(long **)(in_RDI + 6); local_20 != (undefined8 *)0x0;
        local_20 = (long *)local_20[1]) {
      *(long *)(in_RDI + 0x22) = *local_20;
      FAudio_INTERNAL_FlushPendingBuffers(in_stack_ffffffffffffffd0);
      if (*(char *)(*(long *)(in_RDI + 0x22) + 0x118) != '\0') {
        FAudio_INTERNAL_MixSource((FAudioSourceVoice *)audio);
        FAudio_INTERNAL_FlushPendingBuffers(in_stack_ffffffffffffffd0);
      }
    }
    in_RDI[0x22] = 0.0;
    in_RDI[0x23] = 0.0;
    FAudio_PlatformUnlockMutex((FAudioMutex)0x12e6f3);
    FAudio_PlatformLockMutex((FAudioMutex)0x12e701);
    for (local_20 = *(long **)(in_RDI + 8); local_20 != (long *)0x0;
        local_20 = *(long **)((long)local_20 + 8)) {
      FAudio_INTERNAL_MixSubmix(unaff_retaddr);
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x12e742);
    if ((*(float *)(*(long *)(in_RDI + 4) + 0xa8) != 1.0) ||
       (NAN(*(float *)(*(long *)(in_RDI + 4) + 0xa8)))) {
      (*FAudio_INTERNAL_Amplify)
                (*(float **)(*(long *)(in_RDI + 4) + 200),
                 (int)in_RDI[3] * *(int *)(*(long *)(in_RDI + 4) + 0xd8),
                 *(float *)(*(long *)(in_RDI + 4) + 0xa8));
    }
    FAudio_PlatformLockMutex((FAudioMutex)0x12e7be);
    if (*(int *)(*(long *)(in_RDI + 4) + 0x4c) != 0) {
      fVar1 = in_RDI[3];
      pfVar3 = FAudio_INTERNAL_ProcessEffectChain(unaff_retaddr,in_RDI,(uint32_t *)in_RSI);
      if (pfVar3 != in_RSI) {
        SDL_memcpy(in_RSI,pfVar3,
                   (ulong)(uint)((int)fVar1 * *(int *)(*(long *)(in_RDI + 4) + 0xb8)) << 2);
      }
      if ((uint)fVar1 < (uint)in_RDI[3]) {
        SDL_memset(in_RSI + (uint)((int)fVar1 * *(int *)(*(long *)(in_RDI + 4) + 0xb8)),0,
                   (ulong)(uint)((int)in_RDI[3] - (int)fVar1) << 2);
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x12e89e);
    FAudio_PlatformLockMutex((FAudioMutex)0x12e8ac);
    for (local_20 = *(long **)(in_RDI + 10); local_20 != (long *)0x0; local_20 = (long *)local_20[1]
        ) {
      lVar2 = *local_20;
      if (*(long *)(lVar2 + 8) != 0) {
        (**(code **)(lVar2 + 8))(lVar2);
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x12e909);
  }
  return;
}

Assistant:

static void FAUDIOCALL FAudio_INTERNAL_GenerateOutput(FAudio *audio, float *output)
{
	uint32_t totalSamples;
	LinkedList *list;
	float *effectOut;
	FAudioEngineCallback *callback;

	LOG_FUNC_ENTER(audio)
	if (!audio->active)
	{
		LOG_FUNC_EXIT(audio)
		return;
	}

	/* Apply any committed changes */
	FAudio_OPERATIONSET_Execute(audio);

	/* ProcessingPassStart callbacks */
	FAudio_PlatformLockMutex(audio->callbackLock);
	LOG_MUTEX_LOCK(audio, audio->callbackLock)
	list = audio->callbacks;
	while (list != NULL)
	{
		callback = (FAudioEngineCallback*) list->entry;
		if (callback->OnProcessingPassStart != NULL)
		{
			callback->OnProcessingPassStart(
				callback
			);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->callbackLock);
	LOG_MUTEX_UNLOCK(audio, audio->callbackLock)

	/* Writes to master will directly write to output, but ONLY if there
	 * isn't any channel-changing effect processing to do first.
	 */
	if (audio->master->master.effectCache != NULL)
	{
		audio->master->master.output = audio->master->master.effectCache;
		FAudio_zero(
			audio->master->master.effectCache,
			(
				sizeof(float) *
				audio->updateSize *
				audio->master->master.inputChannels
			)
		);
	}
	else
	{
		audio->master->master.output = output;
	}

	/* Mix sources */
	FAudio_PlatformLockMutex(audio->sourceLock);
	LOG_MUTEX_LOCK(audio, audio->sourceLock)
	list = audio->sources;
	while (list != NULL)
	{
		audio->processingSource = (FAudioSourceVoice*) list->entry;

		FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
		if (audio->processingSource->src.active)
		{
			FAudio_INTERNAL_MixSource(audio->processingSource);
			FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
		}

		list = list->next;
	}
	audio->processingSource = NULL;
	FAudio_PlatformUnlockMutex(audio->sourceLock);
	LOG_MUTEX_UNLOCK(audio, audio->sourceLock)

	/* Mix submixes, ordered by processing stage */
	FAudio_PlatformLockMutex(audio->submixLock);
	LOG_MUTEX_LOCK(audio, audio->submixLock)
	list = audio->submixes;
	while (list != NULL)
	{
		FAudio_INTERNAL_MixSubmix((FAudioSubmixVoice*) list->entry);
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->submixLock);
	LOG_MUTEX_UNLOCK(audio, audio->submixLock)

	/* Apply master volume */
	if (audio->master->volume != 1.0f)
	{
		FAudio_INTERNAL_Amplify(
			audio->master->master.output,
			audio->updateSize * audio->master->master.inputChannels,
			audio->master->volume
		);
	}

	/* Process master effect chain */
	FAudio_PlatformLockMutex(audio->master->effectLock);
	LOG_MUTEX_LOCK(audio, audio->master->effectLock)
	if (audio->master->effects.count > 0)
	{
		totalSamples = audio->updateSize;
		effectOut = FAudio_INTERNAL_ProcessEffectChain(
			audio->master,
			audio->master->master.output,
			&totalSamples
		);

		if (effectOut != output)
		{
			FAudio_memcpy(
				output,
				effectOut,
				totalSamples * audio->master->outputChannels * sizeof(float)
			);
		}
		if (totalSamples < audio->updateSize)
		{
			FAudio_zero(
				output + (totalSamples * audio->master->outputChannels),
				(audio->updateSize - totalSamples) * sizeof(float)
			);
		}
	}
	FAudio_PlatformUnlockMutex(audio->master->effectLock);
	LOG_MUTEX_UNLOCK(audio, audio->master->effectLock)

	/* OnProcessingPassEnd callbacks */
	FAudio_PlatformLockMutex(audio->callbackLock);
	LOG_MUTEX_LOCK(audio, audio->callbackLock)
	list = audio->callbacks;
	while (list != NULL)
	{
		callback = (FAudioEngineCallback*) list->entry;
		if (callback->OnProcessingPassEnd != NULL)
		{
			callback->OnProcessingPassEnd(
				callback
			);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->callbackLock);
	LOG_MUTEX_UNLOCK(audio, audio->callbackLock)

	LOG_FUNC_EXIT(audio)
}